

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

void ot::commissioner::BorderAgentFromJson(BorderAgent *aAgent,json *aJson)

{
  ErrorCode EVar1;
  pointer puVar2;
  bool bVar3;
  State SVar4;
  const_reference pvVar5;
  JsonException *this;
  unsigned_short ret;
  key_type local_218;
  Error local_1f8;
  undefined1 local_1d0 [40];
  uint16_t local_1a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1a0;
  string local_188 [32];
  State local_168 [2];
  string local_160 [32];
  uint64_t local_140;
  string local_138 [32];
  string local_118 [32];
  Timestamp local_f8;
  uint32_t local_f0;
  string local_e8 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  string local_b0 [32];
  uint8_t local_90;
  undefined1 uStack_8f;
  uint16_t uStack_8e;
  string local_88 [32];
  UnixTime local_68;
  uint local_60;
  Error local_58;
  
  BorderAgent::BorderAgent((BorderAgent *)local_1d0);
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[5],_0>(aJson,(char (*) [5])0x227f40);
  if (bVar3) {
    local_60 = local_60 | 1;
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Addr","");
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,&local_218);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
               pvVar5);
    std::__cxx11::string::operator=((string *)(local_1d0 + 8),(string *)&local_1f8);
    if ((pointer)local_1f8._0_8_ != (pointer)((long)&local_1f8 + 0x10U)) {
      operator_delete((void *)local_1f8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
  }
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[5],_0>(aJson,(char (*) [5])0x22757b);
  if (bVar3) {
    local_60 = local_60 | 2;
    local_1f8._0_8_ = (pointer)((long)&local_1f8 + 0x10U);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"Port","");
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)&local_1f8);
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_short,_0>
              (pvVar5,(unsigned_short *)&local_218);
    local_1a8 = (uint16_t)local_218._M_dataplus._M_p;
    if ((pointer)local_1f8._0_8_ != (pointer)((long)&local_1f8 + 0x10U)) {
      operator_delete((void *)local_1f8._0_8_);
    }
  }
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[14],_0>(aJson,(char (*) [14])"ThreadVersion");
  if (bVar3) {
    local_60 = local_60 | 4;
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"ThreadVersion","");
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,&local_218);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
               pvVar5);
    std::__cxx11::string::operator=(local_188,(string *)&local_1f8);
    if ((pointer)local_1f8._0_8_ != (pointer)((long)&local_1f8 + 0x10U)) {
      operator_delete((void *)local_1f8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
  }
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[6],_0>(aJson,(char (*) [6])"State");
  if (bVar3) {
    local_60 = local_60 | 8;
    local_1f8._0_8_ = (pointer)((long)&local_1f8 + 0x10U);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"State","");
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)&local_1f8);
    SVar4 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::get<ot::commissioner::BorderAgent::State,_ot::commissioner::BorderAgent::State,_0>
                      (pvVar5);
    local_168[0]._0_2_ = SVar4._0_2_;
    if ((pointer)local_1f8._0_8_ != (pointer)((long)&local_1f8 + 0x10U)) {
      operator_delete((void *)local_1f8._0_8_);
    }
  }
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[12],_0>(aJson,(char (*) [12])"NetworkName");
  if (bVar3) {
    local_60 = local_60 | 0x10;
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"NetworkName","");
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,&local_218);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
               pvVar5);
    std::__cxx11::string::operator=(local_160,(string *)&local_1f8);
    if ((pointer)local_1f8._0_8_ != (pointer)((long)&local_1f8 + 0x10U)) {
      operator_delete((void *)local_1f8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
  }
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[14],_0>(aJson,(char (*) [14])"ExtendedPanId");
  if (bVar3) {
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)aJson,"ExtendedPanId");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_218,pvVar5);
    utils::ParseInteger<unsigned_long>(&local_1f8,&local_140,&local_218);
    EVar1 = local_1f8.mCode;
    if (local_1f8.mMessage._M_dataplus._M_p != (pointer)((long)&local_1f8 + 0x18U)) {
      operator_delete(local_1f8.mMessage._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if (EVar1 != kNone) {
      this = (JsonException *)__cxa_allocate_exception(0x38);
      pvVar5 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)aJson,"ExtendedPanId");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                 pvVar5);
      utils::ParseInteger<unsigned_long>(&local_58,&local_140,(string *)&local_1f8);
      JsonException::JsonException(this,&local_58);
      __cxa_throw(this,&JsonException::typeinfo,JsonException::~JsonException);
    }
    local_60 = local_60 | 0x20;
  }
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[11],_0>(aJson,(char (*) [11])"VendorName");
  if (bVar3) {
    local_60 = local_60 | 0x40;
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"VendorName","");
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,&local_218);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
               pvVar5);
    std::__cxx11::string::operator=(local_138,(string *)&local_1f8);
    if ((pointer)local_1f8._0_8_ != (pointer)((long)&local_1f8 + 0x10U)) {
      operator_delete((void *)local_1f8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
  }
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[10],_0>(aJson,(char (*) [10])"ModelName");
  if (bVar3) {
    local_60 = local_60 | 0x80;
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"ModelName","");
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,&local_218);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
               pvVar5);
    std::__cxx11::string::operator=(local_118,(string *)&local_1f8);
    if ((pointer)local_1f8._0_8_ != (pointer)((long)&local_1f8 + 0x10U)) {
      operator_delete((void *)local_1f8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
  }
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[16],_0>(aJson,(char (*) [16])"ActiveTimestamp");
  if (bVar3) {
    local_60 = local_60 | 0x100;
    local_1f8._0_8_ = (pointer)((long)&local_1f8 + 0x10U);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"ActiveTimestamp","");
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)&local_1f8);
    nlohmann::detail::from_json_fn::operator()
              ((from_json_fn *)
               &nlohmann::detail::static_const<nlohmann::detail::from_json_fn>::value,pvVar5,
               (Timestamp *)&local_218);
    local_f8 = (Timestamp)local_218._M_dataplus._M_p;
    if ((pointer)local_1f8._0_8_ != (pointer)((long)&local_1f8 + 0x10U)) {
      operator_delete((void *)local_1f8._0_8_);
    }
  }
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[12],_0>(aJson,(char (*) [12])"PartitionId");
  if (bVar3) {
    local_60 = local_60 | 0x200;
    local_1f8._0_8_ = (pointer)((long)&local_1f8 + 0x10U);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"PartitionId","");
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)&local_1f8);
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_int,_0>
              (pvVar5,(uint *)&local_218);
    local_f0 = (uint32_t)local_218._M_dataplus._M_p;
    if ((pointer)local_1f8._0_8_ != (pointer)((long)&local_1f8 + 0x10U)) {
      operator_delete((void *)local_1f8._0_8_);
    }
  }
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[11],_0>(aJson,(char (*) [11])"VendorData");
  if (bVar3) {
    local_60 = local_60 | 0x400;
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"VendorData","");
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,&local_218);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
               pvVar5);
    std::__cxx11::string::operator=(local_e8,(string *)&local_1f8);
    if ((pointer)local_1f8._0_8_ != (pointer)((long)&local_1f8 + 0x10U)) {
      operator_delete((void *)local_1f8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
  }
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[10],_0>(aJson,(char (*) [10])"VendorOui");
  if (bVar3) {
    local_60 = local_60 | 0x800;
    local_1f8._0_8_ = (pointer)((long)&local_1f8 + 0x10U);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"VendorOui","");
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)&local_1f8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_0>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_218,pvVar5);
    puVar2 = local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_218._M_dataplus._M_p;
    local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_218._M_string_length;
    local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_218.field_2._M_allocated_capacity;
    local_218._M_dataplus._M_p = (pointer)0x0;
    local_218._M_string_length = 0;
    local_218.field_2._M_allocated_capacity = 0;
    if ((Timestamp)puVar2 != (Timestamp)0x0) {
      operator_delete(puVar2);
      if ((Timestamp)local_218._M_dataplus._M_p != (Timestamp)0x0) {
        operator_delete(local_218._M_dataplus._M_p);
      }
    }
    if ((pointer)local_1f8._0_8_ != (pointer)((long)&local_1f8 + 0x10U)) {
      operator_delete((void *)local_1f8._0_8_);
    }
  }
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[11],_0>(aJson,(char (*) [11])"DomainName");
  if (bVar3) {
    local_60 = local_60 | 0x1000;
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"DomainName","");
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,&local_218);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
               pvVar5);
    std::__cxx11::string::operator=(local_b0,(string *)&local_1f8);
    if ((pointer)local_1f8._0_8_ != (pointer)((long)&local_1f8 + 0x10U)) {
      operator_delete((void *)local_1f8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
  }
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[13],_0>(aJson,(char (*) [13])"BbrSeqNumber");
  if (bVar3) {
    local_60 = local_60 | 0x2000;
    local_1f8._0_8_ = (pointer)((long)&local_1f8 + 0x10U);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"BbrSeqNumber","");
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)&local_1f8);
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_char,_0>
              (pvVar5,(uchar *)&local_218);
    local_90 = (uint8_t)local_218._M_dataplus._M_p;
    if ((pointer)local_1f8._0_8_ != (pointer)((long)&local_1f8 + 0x10U)) {
      operator_delete((void *)local_1f8._0_8_);
    }
  }
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[8],_0>(aJson,(char (*) [8])"BbrPort");
  if (bVar3) {
    local_60 = local_60 | 0x4000;
    local_1f8._0_8_ = (pointer)((long)&local_1f8 + 0x10U);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"BbrPort","");
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)&local_1f8);
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_short,_0>
              (pvVar5,(unsigned_short *)&local_218);
    uStack_8e = (uint16_t)local_218._M_dataplus._M_p;
    if ((pointer)local_1f8._0_8_ != (pointer)((long)&local_1f8 + 0x10U)) {
      operator_delete((void *)local_1f8._0_8_);
    }
  }
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[12],_0>(aJson,(char (*) [12])"ServiceName");
  if (bVar3) {
    local_60 = local_60 | 0x10000;
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"ServiceName","");
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,&local_218);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
               pvVar5);
    std::__cxx11::string::operator=(local_88,(string *)&local_1f8);
    if ((pointer)local_1f8._0_8_ != (pointer)((long)&local_1f8 + 0x10U)) {
      operator_delete((void *)local_1f8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
  }
  std::__cxx11::string::_M_assign((string *)&aAgent->mAddr);
  aAgent->mPort = local_1a8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&aAgent->mDiscriminator,&local_1a0);
  std::__cxx11::string::_M_assign((string *)&aAgent->mThreadVersion);
  *(undefined2 *)&aAgent->mState = local_168[0]._0_2_;
  std::__cxx11::string::_M_assign((string *)&aAgent->mNetworkName);
  aAgent->mExtendedPanId = local_140;
  std::__cxx11::string::_M_assign((string *)&aAgent->mVendorName);
  std::__cxx11::string::_M_assign((string *)&aAgent->mModelName);
  aAgent->mPartitionId = local_f0;
  aAgent->mActiveTimestamp = local_f8;
  std::__cxx11::string::_M_assign((string *)&aAgent->mVendorData);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&aAgent->mVendorOui,&local_c8);
  std::__cxx11::string::_M_assign((string *)&aAgent->mDomainName);
  aAgent->mBbrSeqNumber = local_90;
  aAgent->field_0x141 = uStack_8f;
  aAgent->mBbrPort = uStack_8e;
  std::__cxx11::string::_M_assign((string *)&aAgent->mServiceName);
  aAgent->mPresentFlags = local_60;
  (aAgent->mUpdateTimestamp).mTime = local_68.mTime;
  BorderAgent::~BorderAgent((BorderAgent *)local_1d0);
  return;
}

Assistant:

void BorderAgentFromJson(BorderAgent &aAgent, const nlohmann::json &aJson)
{
    BorderAgent agent;

#define SET_IF_PRESENT(field)                                                  \
    do                                                                         \
    {                                                                          \
        if (aJson.contains(#field))                                            \
        {                                                                      \
            agent.mPresentFlags |= BorderAgent::k##field##Bit;                 \
            agent.m##field = aJson.at(#field).get<decltype(agent.m##field)>(); \
        }                                                                      \
    } while (false)

    SET_IF_PRESENT(Addr);
    SET_IF_PRESENT(Port);
    SET_IF_PRESENT(ThreadVersion);
    SET_IF_PRESENT(State);
    SET_IF_PRESENT(NetworkName);

    if (aJson.contains("ExtendedPanId"))
    {
        SuccessOrThrow(utils::ParseInteger(agent.mExtendedPanId, aJson["ExtendedPanId"]));
        agent.mPresentFlags |= BorderAgent::kExtendedPanIdBit;
    }

    SET_IF_PRESENT(VendorName);
    SET_IF_PRESENT(ModelName);
    SET_IF_PRESENT(ActiveTimestamp);
    SET_IF_PRESENT(PartitionId);
    SET_IF_PRESENT(VendorData);
    SET_IF_PRESENT(VendorOui);
    SET_IF_PRESENT(DomainName);
    SET_IF_PRESENT(BbrSeqNumber);
    SET_IF_PRESENT(BbrPort);
    SET_IF_PRESENT(ServiceName);

#undef SET_IF_PRESENT

    aAgent = agent;
}